

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void lyp_ext_instance_rm(ly_ctx *ctx,lys_ext_instance ***ext,uint8_t *size,uint8_t index)

{
  byte local_22;
  uint8_t i;
  uint8_t index_local;
  uint8_t *size_local;
  lys_ext_instance ***ext_local;
  ly_ctx *ctx_local;
  
  lys_extension_instances_free(ctx,(*ext)[index]->ext,(uint)(*ext)[index]->ext_size);
  lydict_remove(ctx,(*ext)[index]->arg_value);
  free((*ext)[index]);
  for (local_22 = index + 1; local_22 < *size; local_22 = local_22 + 1) {
    (*ext)[(int)(local_22 - 1)] = (*ext)[local_22];
  }
  (*ext)[(int)(*size - 1)] = (lys_ext_instance *)0x0;
  *size = *size + 0xff;
  if (*size == '\0') {
    free(*ext);
  }
  return;
}

Assistant:

void
lyp_ext_instance_rm(struct ly_ctx *ctx, struct lys_ext_instance ***ext, uint8_t *size, uint8_t index)
{
    uint8_t i;

    lys_extension_instances_free(ctx, (*ext)[index]->ext, (*ext)[index]->ext_size);
    lydict_remove(ctx, (*ext)[index]->arg_value);
    free((*ext)[index]);

    /* move the rest of the array */
    for (i = index + 1; i < (*size); i++) {
        (*ext)[i - 1] = (*ext)[i];
    }
    /* clean the last cell in the array structure */
    (*ext)[(*size) - 1] = NULL;
    /* the array is not reallocated here, just change its size */
    (*size) = (*size) - 1;

    if (!(*size)) {
        /* ext array is empty */
        free((*ext));
        ext = NULL;
    }
}